

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theory.cpp
# Opt level: O3

OperatorType * Kernel::Theory::getConversionOperationType(Interpretation i)

{
  OperatorType *pOVar1;
  
  pOVar1 = (OperatorType *)
           (*(code *)(&DAT_008fb524 + *(int *)(&DAT_008fb524 + (ulong)(i - INT_TO_RAT) * 4)))();
  return pOVar1;
}

Assistant:

OperatorType* Theory::getConversionOperationType(Interpretation i)
{
  TermList from, to;
  switch(i) {
  case INT_TO_RAT:
    from = AtomicSort::intSort();
    to = AtomicSort::rationalSort();
    break;
  case INT_TO_REAL:
    from = AtomicSort::intSort();
    to = AtomicSort::realSort();
    break;
  case RAT_TO_INT:
    from = AtomicSort::rationalSort();
    to = AtomicSort::intSort();
    break;
  case RAT_TO_REAL:
    from = AtomicSort::rationalSort();
    to = AtomicSort::realSort();
    break;
  case REAL_TO_INT:
    from = AtomicSort::realSort();
    to = AtomicSort::intSort();
    break;
  case REAL_TO_RAT:
    from = AtomicSort::realSort();
    to = AtomicSort::rationalSort();
    break;
  default:
    ASSERTION_VIOLATION;
  }
  return OperatorType::getFunctionType({from}, to);
}